

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSolve(SUNLinearSolver S,SUNMatrix A,N_Vector x,N_Vector b,sunrealtype tol,
                       int zeroguess,int myid)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  N_Vector in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  uint in_R9D;
  N_Vector in_XMM0_Qa;
  double dVar4;
  double dVar5;
  N_Vector y;
  double stop_time;
  double start_time;
  int failure;
  int local_4;
  
  uVar3 = N_VClone(in_RDX);
  if (in_R8D == 0) {
    sqrt(2.220446049250313e-16);
    N_VAddConst(in_RDX,uVar3);
  }
  else {
    N_VConst(0,uVar3);
  }
  sync_device();
  uVar1 = SUNLinSolSetZeroGuess(in_RDI,in_R8D);
  if (uVar1 == 0) {
    dVar4 = get_time();
    uVar1 = SUNLinSolSolve(in_XMM0_Qa,in_RDI,in_RSI,uVar3,in_RCX);
    sync_device();
    dVar5 = get_time();
    if (uVar1 == 0) {
      iVar2 = check_vector(in_RCX,in_XMM0_Qa,(sunrealtype)CONCAT44(in_R8D,in_R9D));
      if (iVar2 == 0) {
        if ((in_R9D == 0) && (printf("    PASSED test -- SUNLinSolSolve \n"), print_time != 0)) {
          printf("    SUNLinSolSolve Time: %22.15e \n \n",dVar5 - dVar4);
        }
        N_VDestroy(uVar3);
        local_4 = 0;
      }
      else {
        printf(">>> FAILED test -- SUNLinSolSolve check, Proc %d \n",(ulong)in_R9D);
        if (print_time != 0) {
          printf("    SUNLinSolSolve Time: %22.15e \n \n",dVar5 - dVar4);
        }
        N_VDestroy(uVar3);
        local_4 = 1;
      }
    }
    else {
      printf(">>> FAILED test -- SUNLinSolSolve returned %d on Proc %d \n",(ulong)uVar1,
             (ulong)in_R9D);
      N_VDestroy(uVar3);
      local_4 = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)in_R9D);
    N_VDestroy(uVar3);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolSolve(SUNLinearSolver S, SUNMatrix A, N_Vector x, N_Vector b,
                        sunrealtype tol, sunbooleantype zeroguess, int myid)
{
  int failure;
  double start_time, stop_time;
  N_Vector y;

  /* clone to create solution vector */
  y = N_VClone(x);

  /* set initial guess for the linear system */
  if (zeroguess) { N_VConst(ZERO, y); }
  else { N_VAddConst(x, SUNRsqrt(SUN_UNIT_ROUNDOFF), y); }

  sync_device();

  /* signal if the initial guess is zero or non-zero */
  failure = SUNLinSolSetZeroGuess(S, zeroguess);
  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",
           failure, myid);
    N_VDestroy(y);
    return (1);
  }

  /* perform solve */
  start_time = get_time();
  failure    = SUNLinSolSolve(S, A, y, b, tol);
  sync_device();
  stop_time = get_time();
  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSolve returned %d on Proc %d \n",
           failure, myid);
    N_VDestroy(y);
    return (1);
  }

  /* Check solution */
  failure = check_vector(x, y, 10.0 * tol);
  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSolve check, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolSolve Time: %22.15e \n \n", stop_time - start_time);
    N_VDestroy(y);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSolve \n");
    PRINT_TIME("    SUNLinSolSolve Time: %22.15e \n \n", stop_time - start_time);
  }

  N_VDestroy(y);
  return (0);
}